

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTests.cpp
# Opt level: O2

void globAndCheck(path *basePath,string_view pattern,GlobMode mode,GlobRank expectedRank,
                 error_code expectedEc,initializer_list<const_char_*> expected)

{
  iterator ppcVar1;
  path *ppVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  size_type extraout_RDX;
  pointer ppVar6;
  path *ppVar7;
  AssertionHandler *pAVar8;
  AssertionHandler *this;
  long lVar9;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  string_view pattern_00;
  error_code *in_stack_fffffffffffffe30;
  GlobRank rank;
  GlobRank expectedRank_local;
  ReusableStringStream local_1b8;
  undefined1 local_1a0 [8];
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  char *local_180;
  GlobRank *local_178;
  error_code ec;
  AssertionHandler catchAssertionHandler;
  char *local_f8;
  GlobMode local_f0;
  undefined1 local_d8 [48];
  string_view pattern_local;
  SmallVector<std::filesystem::__cxx11::path,_2UL> results;
  
  pattern_00._M_len = pattern._M_str;
  results.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)results.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  results.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  expectedRank_local = expectedRank;
  pattern_local._M_len = pattern._M_len;
  pattern_local._M_str = pattern_00._M_len;
  ec._M_cat = (error_category *)std::_V2::system_category();
  pattern_00._M_str._0_4_ = mode;
  pattern_00._M_str._4_4_ = 0;
  rank = slang::svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(GlobMode)&results,
                       (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,SUB81(&ec,0),
                       in_stack_fffffffffffffe30);
  local_1a0 = (undefined1  [8])0x8bf20a;
  local_198 = 0x67;
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "rank == expectedRank";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_1a0,capturedExpression,
             ContinueOnFailure);
  local_190._M_allocated_capacity = (size_type)&rank;
  local_178 = &expectedRank_local;
  local_198._0_2_ = CONCAT11(rank == expectedRank_local,true);
  local_1a0 = (undefined1  [8])&PTR_streamReconstructedExpression_00b6c0b0;
  local_190._8_8_ = (long)"!==" + 1;
  local_180 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_1a0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_1a0 = (undefined1  [8])0x8bf20a;
  local_198 = 0x68;
  capturedExpression_00.m_size = 0x21;
  capturedExpression_00.m_start = "results.size() == expected.size()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_1a0,capturedExpression_00,
             ContinueOnFailure);
  pAVar8 = (AssertionHandler *)local_1a0;
  local_198._0_2_ =
       CONCAT11(results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len == expected._M_len
                ,true);
  local_1a0 = (undefined1  [8])&PTR_streamReconstructedExpression_00b65bb8;
  local_190._M_allocated_capacity =
       results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
  local_190._8_8_ = (long)"!==" + 1;
  local_180 = (char *)0x2;
  local_178 = (GlobRank *)expected._M_len;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)pAVar8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  if ((ec._M_cat != expectedEc._M_cat) || (ec._M_value != expectedEc._M_value)) {
    catchAssertionHandler.m_assertionInfo.macroName.m_start._0_4_ =
         std::error_code::default_error_condition();
    pAVar8 = &catchAssertionHandler;
    catchAssertionHandler.m_assertionInfo.macroName.m_size = extraout_RDX;
    bVar4 = std::operator==(&expectedEc,(error_condition *)pAVar8);
    if (!bVar4) {
      local_1a0 = (undefined1  [8])0x8bf20a;
      local_198 = 0x6b;
      macroName_01.m_size = 10;
      macroName_01.m_start = "FAIL_CHECK";
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_1a0,
                 (StringRef)ZEXT816(0x88e35c),ContinueOnFailure);
      local_1b8.m_index = 0;
      local_1b8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_1b8);
      (**(code **)(*(long *)ec._M_cat + 0x20))(local_d8,ec._M_cat,ec._M_value);
      std::operator<<(local_1b8.m_oss,(string *)local_d8);
      std::operator<<(local_1b8.m_oss," != ");
      (**(code **)(*(long *)expectedEc._M_cat + 0x20))
                (&local_f8,expectedEc._M_cat,expectedEc._M_value);
      std::operator<<(local_1b8.m_oss,(string *)&local_f8);
      Catch::ReusableStringStream::str_abi_cxx11_((string *)local_1a0,&local_1b8);
      pAVar8 = (AssertionHandler *)0x12;
      Catch::AssertionHandler::handleMessage
                (&catchAssertionHandler,ExplicitFailure,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)local_d8);
      Catch::ReusableStringStream::~ReusableStringStream(&local_1b8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
  }
  ppcVar1 = expected._M_array + expected._M_len;
  do {
    if (expected._M_array == ppcVar1) {
      ppVar6 = results.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
      for (lVar9 = results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
          lVar9 != 0; lVar9 = lVar9 + -0x28) {
        pAVar8 = (AssertionHandler *)local_1a0;
        if (mode == Files) {
          local_1a0 = (undefined1  [8])0x8bf20a;
          local_198 = 0x79;
          capturedExpression_02.m_size = 0x19;
          capturedExpression_02.m_start = "fs::is_regular_file(path)";
          macroName_04.m_size = 5;
          macroName_04.m_start = "CHECK";
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_1a0,
                     capturedExpression_02,ContinueOnFailure);
          bVar4 = std::filesystem::is_regular_file(ppVar6);
          local_1a0[0] = bVar4;
          Catch::AssertionHandler::handleExpr<bool>
                    (&catchAssertionHandler,(ExprLhs<bool> *)local_1a0);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
        }
        else {
          local_1a0 = (undefined1  [8])0x8bf20a;
          local_198 = 0x7b;
          capturedExpression_01.m_size = 0x16;
          capturedExpression_01.m_start = "fs::is_directory(path)";
          macroName_03.m_size = 5;
          macroName_03.m_start = "CHECK";
          Catch::AssertionHandler::AssertionHandler
                    (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_1a0,
                     capturedExpression_01,ContinueOnFailure);
          bVar4 = std::filesystem::is_directory(ppVar6);
          local_1a0[0] = bVar4;
          Catch::AssertionHandler::handleExpr<bool>
                    (&catchAssertionHandler,(ExprLhs<bool> *)local_1a0);
          Catch::AssertionHandler::complete(&catchAssertionHandler);
        }
        Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
        ppVar6 = ppVar6 + 1;
      }
      slang::SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
                (&results.super_SmallVectorBase<std::filesystem::__cxx11::path>,
                 (EVP_PKEY_CTX *)pAVar8);
      return;
    }
    pcVar3 = *expected._M_array;
    ppVar2 = results.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
             results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
    ppVar6 = results.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
    local_f8 = pcVar3;
    local_f0 = mode;
    for (lVar9 = results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28;
        ppVar7 = ppVar2, lVar9 != 0; lVar9 = lVar9 + -0x28) {
      cVar5 = std::filesystem::__cxx11::path::has_filename();
      if (cVar5 == '\0') {
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::__cxx11::path::filename((path *)&catchAssertionHandler,(path *)local_1a0);
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)local_d8,&local_f8,auto_format);
        pAVar8 = (AssertionHandler *)local_d8;
        bVar4 = std::filesystem::__cxx11::operator==
                          ((path *)&catchAssertionHandler,(path *)local_d8);
        std::filesystem::__cxx11::path::~path((path *)local_d8);
        std::filesystem::__cxx11::path::~path((path *)&catchAssertionHandler);
        this = (AssertionHandler *)local_1a0;
      }
      else {
        std::filesystem::__cxx11::path::filename((path *)&catchAssertionHandler,ppVar6);
        std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                  ((path *)local_1a0,&local_f8,auto_format);
        pAVar8 = (AssertionHandler *)local_1a0;
        bVar4 = std::filesystem::__cxx11::operator==
                          ((path *)&catchAssertionHandler,(path *)local_1a0);
        std::filesystem::__cxx11::path::~path((path *)local_1a0);
        this = &catchAssertionHandler;
      }
      std::filesystem::__cxx11::path::~path((path *)this);
      ppVar7 = ppVar6;
      if (bVar4 != false) break;
      ppVar6 = ppVar6 + 1;
    }
    if (ppVar7 == results.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
                  results.super_SmallVectorBase<std::filesystem::__cxx11::path>.len) {
      local_1a0 = (undefined1  [8])0x8bf20a;
      local_198 = 0x73;
      macroName_02.m_size = 10;
      macroName_02.m_start = "FAIL_CHECK";
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_1a0,
                 (StringRef)ZEXT816(0x88e35c),ContinueOnFailure);
      local_d8._0_8_ = (char *)0x0;
      local_d8._8_8_ = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_d8);
      std::operator<<((ostream *)local_d8._8_8_,pcVar3);
      std::operator<<((ostream *)local_d8._8_8_," is not found in results for ");
      Catch::ReusableStringStream::operator<<((ReusableStringStream *)local_d8,&pattern_local);
      Catch::ReusableStringStream::str_abi_cxx11_
                ((string *)local_1a0,(ReusableStringStream *)local_d8);
      pAVar8 = (AssertionHandler *)0x12;
      Catch::AssertionHandler::handleMessage
                (&catchAssertionHandler,ExplicitFailure,(string *)local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_d8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    expected._M_array = expected._M_array + 1;
  } while( true );
}

Assistant:

static void globAndCheck(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                         GlobRank expectedRank, std::error_code expectedEc,
                         std::initializer_list<const char*> expected) {
    SmallVector<fs::path> results;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, mode, results, /* expandEnvVars */ true, ec);

    CHECK(rank == expectedRank);
    CHECK(results.size() == expected.size());

    if (ec != expectedEc && ec.default_error_condition() != expectedEc)
        FAIL_CHECK(ec.message() << " != " << expectedEc.message());

    for (auto str : expected) {
        auto it = std::ranges::find_if(results, [str, mode](auto& item) {
            return item.has_filename() ? item.filename() == str
                                       : item.parent_path().filename() == str;
        });
        if (it == results.end()) {
            FAIL_CHECK(str << " is not found in results for " << pattern);
        }
    }

    for (auto& path : results) {
        if (mode == GlobMode::Files)
            CHECK(fs::is_regular_file(path));
        else
            CHECK(fs::is_directory(path));
    }
}